

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

bool __thiscall BufferedReader::seek(BufferedReader *this,int readerID,int64_t offset)

{
  undefined1 uVar1;
  iterator iVar2;
  key_type_conflict local_14;
  
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
          ::find(&(this->m_readers)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_readers)._M_t._M_impl.super__Rb_tree_header) {
    uVar1 = 0;
  }
  else {
    uVar1 = (**(code **)(*(long *)iVar2._M_node[1]._M_parent + 0x10))
                      (iVar2._M_node[1]._M_parent,offset);
  }
  return (bool)uVar1;
}

Assistant:

bool BufferedReader::seek(const int readerID, const int64_t offset)
{
    const auto itr = m_readers.find(readerID);
    if (itr != m_readers.end())
    {
        ReaderData* data = itr->second;
        return data->incSeek(offset);
    }
    return false;
}